

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

int __thiscall net_uv::TCPSocket::connect(TCPSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  sockaddr *addr;
  uv_tcp_t *tcp;
  uv_connect_t *req;
  undefined4 in_register_00000034;
  char *ip;
  allocator<char> local_4d;
  uint32_t addr_len;
  string local_48 [32];
  
  ip = (char *)CONCAT44(in_register_00000034,__fd);
  addr_len = 0;
  addr = net_getsocketAddr(ip,(uint32_t)__addr,&addr_len);
  if (addr == (sockaddr *)0x0) {
    iVar1 = 0;
    net_uvLog(3,"[%s:%d]Failed to get address information",ip,(ulong)__addr & 0xffffffff);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>(local_48,ip,&local_4d);
    std::__cxx11::string::_M_assign((string *)&(this->super_Socket).m_ip);
    std::__cxx11::string::~string(local_48);
    (this->super_Socket).m_port = (uint32_t)__addr;
    tcp = this->m_tcp;
    if (tcp == (uv_tcp_t *)0x0) {
      tcp = (uv_tcp_t *)malloc(0xf8);
      uv_tcp_init((this->super_Socket).m_loop,tcp);
      tcp->data = this;
    }
    req = (uv_connect_t *)malloc(0x60);
    req->data = this;
    iVar1 = uv_tcp_connect(req,tcp,addr,uv_on_after_connect);
    free(addr);
    if (iVar1 == 0) {
      this->m_tcp = tcp;
      net_adjustBuffSize((uv_handle_t *)tcp,0x10000,0x10000);
      iVar1 = (int)CONCAT71((int7)((ulong)this >> 8),1);
    }
    else {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

bool TCPSocket::connect(const char* ip, uint32_t port)
{
	uint32_t addr_len = 0;
	struct sockaddr* addr = net_getsocketAddr(ip, port, &addr_len);

	if (addr == NULL)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "[%s:%d]Failed to get address information", ip, port);
		return false;
	}

	this->setIp(ip);
	this->setPort(port);

	auto tcp = m_tcp;
	if (tcp == NULL)
	{
		tcp = (uv_tcp_t*)fc_malloc(sizeof(uv_tcp_t));
		int32_t r = uv_tcp_init(m_loop, tcp);
		CHECK_UV_ASSERT(r);

		tcp->data = this;
	}
	
	uv_connect_t* connectReq = (uv_connect_t*)fc_malloc(sizeof(uv_connect_t));
	connectReq->data = this;
	int32_t r = uv_tcp_connect(connectReq, tcp, addr, uv_on_after_connect);
	fc_free(addr);
	if (r)
	{
		return false;
	}
	setTcp(tcp);
	net_adjustBuffSize((uv_handle_t*)tcp, TCP_UV_SOCKET_RECV_BUF_LEN, TCP_UV_SOCKET_SEND_BUF_LEN);
	return true;
}